

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SkeletonReader::~SkeletonReader(SkeletonReader *this)

{
  ~SkeletonReader(this);
  operator_delete(this);
  return;
}

Assistant:

SkeletonReader::~SkeletonReader()
{
    /* m_Skeleton deconstructor does close and finalize */
    if (m_Verbosity == 5)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank << " deconstructor on " << m_Name << "\n";
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}